

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O3

int ogg_stream_pageout(ogg_stream_state *os,ogg_page *og)

{
  int iVar1;
  
  if ((os == (ogg_stream_state *)0x0) || (os->body_data == (uchar *)0x0)) {
    return 0;
  }
  if (os->e_o_s == 0) {
    iVar1 = 0;
    if ((os->lacing_fill == 0) || (os->b_o_s != 0)) goto LAB_001e57c8;
  }
  else if (os->lacing_fill == 0) {
    iVar1 = 0;
    goto LAB_001e57c8;
  }
  iVar1 = 1;
LAB_001e57c8:
  iVar1 = ogg_stream_flush_i(os,og,iVar1,0x1000);
  return iVar1;
}

Assistant:

int ogg_stream_pageout(ogg_stream_state *os, ogg_page *og){
  int force=0;
  if(ogg_stream_check(os)) return 0;

  if((os->e_o_s&&os->lacing_fill) ||          /* 'were done, now flush' case */
     (os->lacing_fill&&!os->b_o_s))           /* 'initial header page' case */
    force=1;

  return(ogg_stream_flush_i(os,og,force,4096));
}